

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

void mpc_input_mark(mpc_input_t *i)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  mpc_state_t *pmVar7;
  char *pcVar8;
  
  if (0 < i->backtrack) {
    iVar2 = i->marks_num;
    iVar6 = iVar2 + 1;
    i->marks_num = iVar6;
    if (i->marks_slots <= iVar2) {
      iVar6 = iVar6 / 2 + iVar6;
      i->marks_slots = iVar6;
      pmVar7 = (mpc_state_t *)realloc(i->marks,(long)iVar6 << 5);
      i->marks = pmVar7;
      pcVar8 = (char *)realloc(i->lasts,(long)i->marks_slots);
      i->lasts = pcVar8;
      iVar6 = i->marks_num;
    }
    pmVar7 = i->marks;
    lVar3 = (i->state).pos;
    lVar4 = (i->state).row;
    uVar5 = *(undefined8 *)&(i->state).term;
    plVar1 = &pmVar7[(long)iVar6 + -1].col;
    *plVar1 = (i->state).col;
    plVar1[1] = uVar5;
    pmVar7 = pmVar7 + (long)iVar6 + -1;
    pmVar7->pos = lVar3;
    pmVar7->row = lVar4;
    i->lasts[(long)i->marks_num + -1] = i->last;
    if ((i->type == 2) && (i->marks_num == 1)) {
      pcVar8 = (char *)calloc(1,1);
      i->buffer = pcVar8;
    }
  }
  return;
}

Assistant:

static void mpc_input_mark(mpc_input_t *i) {

  if (i->backtrack < 1) { return; }

  i->marks_num++;

  if (i->marks_num > i->marks_slots) {
    i->marks_slots = i->marks_num + i->marks_num / 2;
    i->marks = realloc(i->marks, sizeof(mpc_state_t) * i->marks_slots);
    i->lasts = realloc(i->lasts, sizeof(char) * i->marks_slots);
  }

  i->marks[i->marks_num-1] = i->state;
  i->lasts[i->marks_num-1] = i->last;

  if (i->type == MPC_INPUT_PIPE && i->marks_num == 1) {
    i->buffer = calloc(1, 1);
  }

}